

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Piece.h
# Opt level: O1

optional<libchess::Piece> libchess::Piece::from(char c)

{
  int iVar1;
  optional<libchess::PieceType> oVar2;
  ulong uVar3;
  ulong uVar4;
  
  oVar2 = PieceType::from(c);
  if (((ulong)oVar2.super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
              super__Optional_payload_base<libchess::PieceType> >> 0x20 & 1) == 0) {
    uVar3 = 0;
    uVar4 = 0;
  }
  else {
    uVar4 = 0x100000000;
    iVar1 = isupper((int)c);
    uVar3 = (ulong)oVar2.super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
                   super__Optional_payload_base<libchess::PieceType> & 0xffffffff |
            (ulong)(iVar1 == 0) << 3;
  }
  return (optional<libchess::Piece>)(uVar3 | uVar4);
}

Assistant:

constexpr static std::optional<Piece> from(char c) {
        auto piece_type = PieceType::from(c);
        if (!piece_type) {
            return {};
        }

        Color piece_color = std::isupper(c) ? constants::WHITE : constants::BLACK;
        return Piece::from(*piece_type, piece_color);
    }